

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int av1_get_last_show_frame(AV1_COMP *cpi,YV12_BUFFER_CONFIG *frame)

{
  void *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if ((*(long *)(in_RDI + 0x42d70) == 0) || ((*(byte *)(in_RDI + 0x42368) & 1) != 0)) {
    local_4 = -1;
  }
  else {
    memcpy(in_RSI,(void *)(*(long *)(in_RDI + 0x42d70) + 0x4e0),0xd0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_get_last_show_frame(AV1_COMP *cpi, YV12_BUFFER_CONFIG *frame) {
  if (cpi->last_show_frame_buf == NULL ||
      cpi->oxcf.algo_cfg.skip_postproc_filtering)
    return -1;

  *frame = cpi->last_show_frame_buf->buf;
  return 0;
}